

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

int newton_min_func(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                   double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,
                   double stol,double *xf)

{
  double dVar1;
  double eps2;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L;
  ulong uVar6;
  char *__format;
  size_t sVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  sVar7 = (long)N * 8;
  f = (double *)malloc(sVar7);
  array = (double *)malloc(sVar7);
  xi_00 = (double *)malloc(sVar7);
  x = (double *)malloc(sVar7);
  sVar7 = sVar7 * (long)N;
  H = (double *)malloc(sVar7);
  L = (double *)malloc(sVar7);
  *niter = 0;
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  if (0 < N) {
    uVar6 = 0;
    do {
      xi[uVar6] = dx[uVar6] * xi[uVar6];
      dx[uVar6] = 1.0 / dx[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)N != uVar6);
  }
  dVar9 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar10 = ABS(dVar9);
  iVar5 = 0;
  if (1.79769313486232e+308 <= dVar10) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    iVar5 = 0xf;
  }
  if (NAN(dVar9)) {
    printf("Program Exiting as the function returns NaN");
    iVar5 = 0xf;
  }
  iVar3 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar3 == 0xf) {
    iVar5 = 0xf;
  }
  dVar9 = 0.0;
  if (maxstep <= 0.0) {
    dVar2 = 0.0;
    if (0 < N) {
      uVar6 = 0;
      dVar2 = 0.0;
      do {
        dVar1 = dx[uVar6];
        dVar2 = dVar2 + dVar1 * dVar1;
        dVar9 = dVar9 + dVar1 * xi[uVar6] * dVar1 * xi[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)N != uVar6);
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    if (dVar2 <= dVar9) {
      maxstep = dVar9 * 1000.0;
    }
    else {
      maxstep = dVar2 * 1000.0;
    }
  }
  if (N < 1) {
    dVar10 = array_max_abs(array,N);
    if (dVar10 <= gtol * 0.001) {
LAB_001263ed:
      iVar5 = 1;
    }
    iVar4 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
    iVar3 = 0xf;
    if (iVar4 == 0xf) goto LAB_0012666b;
  }
  else {
    if (dVar10 <= ABS(fsval)) {
      dVar10 = ABS(fsval);
    }
    uVar8 = (ulong)(uint)N;
    uVar6 = 0;
    do {
      dVar9 = ABS(xi[uVar6]);
      if (ABS(xi[uVar6]) <= 1.0 / ABS(dx[uVar6])) {
        dVar9 = 1.0 / ABS(dx[uVar6]);
      }
      array[uVar6] = (ABS(f[uVar6]) * dVar9) / dVar10;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
    dVar10 = array_max_abs(array,N);
    if (dVar10 <= gtol * 0.001) {
      if (N < 1) goto LAB_001263ed;
      uVar6 = 0;
      do {
        xf[uVar6] = xi[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      iVar5 = 1;
    }
    iVar3 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
    if (iVar3 == 0xf) {
      iVar5 = 0xf;
    }
    if (0 < N) {
      memcpy(xi_00,xi,uVar8 << 3);
    }
  }
  iVar3 = iVar5;
  if (iVar5 == 0) {
    do {
      if (MAXITER <= *niter) {
        iVar3 = 4;
        break;
      }
      *niter = *niter + 1;
      modelhess(H,N,dx,eps,L);
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      iVar5 = lnsrch(funcpt,xi_00,f,x,N,dx,maxstep,stol,xf);
      dVar10 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar10)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012661c:
        printf(__format);
LAB_00126623:
        iVar3 = 0xf;
        break;
      }
      if (NAN(dVar10)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_0012661c;
      }
      iVar3 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f);
      if (iVar3 == 0xf) goto LAB_00126623;
      iVar3 = stopcheck(dVar10,N,xi_00,xf,f,dx,fsval,gtol,stol,iVar5);
      iVar5 = hessian_opt(funcpt,funcgrad,xf,N,f,dx,eps,eps2,H);
      if (iVar5 == 0xf) {
        iVar3 = 0xf;
      }
      if (0 < N) {
        memcpy(xi_00,xf,(ulong)(uint)N << 3);
      }
    } while (iVar3 == 0);
  }
  if (0 < N) {
    uVar6 = 0;
    do {
      xi[uVar6] = dx[uVar6] * xi[uVar6];
      dx[uVar6] = 1.0 / dx[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)N != uVar6);
  }
LAB_0012666b:
  free(f);
  free(H);
  free(array);
  free(xi_00);
  free(L);
  free(x);
  return iVar3;
}

Assistant:

int newton_min_func(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double maxstep, int MAXITER,
		int *niter,double eps,double gtol,double stol,double *xf) {
	int rcode,gfdcode,hdcode;
	int i,siter,retval;
	double dt1,dt2,eps2;
	double fx,num,den,stop0,fxf;
	double *jac,*hess,*scheck,*xc,*L,*step;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;
	hdcode = 0;
	//gtol = pow((double) FDVAL,1.0/3.0);
	
	//stol = gtol * gtol;
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	
	
	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//printf("dt1 dt2 %g \n", maxstep);
	//maxstep = 1e15;
	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}
	
	//hessian_fd(funcpt,xi,N,dx,eps2,hess);
	hdcode = hessian_opt(funcpt,funcgrad,xi,N,jac,dx,eps,eps2,hess);
	if (hdcode == 15) {
		rcode = 15;
	}
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		modelhess(hess,N,dx,eps,L);

		scale(jac,1,N,-1.0);
		//mdisplay(hess,N,N);
		
		linsolve_lower(L,N,jac,step);

		scale(jac,1,N,-1.0);
		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf); 
		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}
		//printf("%d \n",iter);
		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jac);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jac,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,eps,hess);
		hdcode = hessian_opt(funcpt,funcgrad,xf,N,jac,dx,eps,eps2,hess);
		if (hdcode == 15) {
			rcode = 15;
		}
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	return rcode;
}